

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

bool __thiscall GEO::Delaunay2d::triangle_is_conflict(Delaunay2d *this,index_t t,double *p)

{
  index_t iVar1;
  int iVar2;
  uint t_00;
  uint uVar3;
  pointer piVar4;
  double *pdVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  Sign SVar9;
  ulong uVar10;
  long lVar11;
  PCK *p3;
  PCK *pPVar12;
  ulong uVar13;
  bool bVar14;
  double *pv [3];
  PCK *local_48;
  double *local_40 [3];
  
  piVar4 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->super_Delaunay).vertices_;
  iVar1 = (this->super_Delaunay).vertex_stride_;
  lVar11 = 0;
  do {
    iVar2 = piVar4[t * 3 + (int)lVar11];
    p3 = (PCK *)(pdVar5 + iVar1 * iVar2);
    pPVar12 = (PCK *)0x0;
    if (iVar2 != -1) {
      pPVar12 = p3;
    }
    (&local_48)[lVar11] = pPVar12;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (local_48 == (PCK *)0x0) {
    uVar13 = 0;
    bVar14 = false;
  }
  else {
    uVar13 = 0;
    do {
      uVar10 = uVar13;
      bVar14 = 1 < uVar10;
      if (uVar10 == 2) {
        bVar8 = false;
        goto LAB_0016e8bf;
      }
      uVar13 = uVar10 + 1;
    } while (local_40[uVar10] != (double *)0x0);
    bVar14 = 1 < uVar10;
  }
  (&local_48)[uVar13] = (PCK *)p;
  SVar9 = PCK::orient_2d((double *)local_48,local_40[0],local_40[1]);
  bVar8 = true;
  if (ZERO < SVar9) goto LAB_0016e8bf;
  if (NEGATIVE < SVar9) {
    t_00 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start[t * 3 + (int)uVar13];
    uVar3 = (this->cell_next_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start[t_00];
    if (-1 < (int)uVar3) goto LAB_0016e8bf;
    if (uVar3 != this->cur_stamp_) {
      bVar8 = triangle_is_conflict(this,t_00,p);
      goto LAB_0016e8bf;
    }
  }
  bVar8 = false;
LAB_0016e8bf:
  if (bVar14) {
    if (this->weighted_ == true) {
      piVar4 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
               super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)p - (long)(this->super_Delaunay).vertices_;
      auVar7._8_8_ = lVar11 >> 0x3f;
      auVar7._0_8_ = lVar11 >> 3;
      SVar9 = PCK::orient_2dlifted_SOS
                        (local_48,local_40[0],local_40[1],p,(double *)p3,pdVar6[(uint)piVar4[t * 3]]
                         ,pdVar6[(uint)piVar4[t * 3 + 1]],pdVar6[(uint)piVar4[t * 3 + 2]],
                         pdVar6[SUB164(auVar7 / SEXT816((long)(int)(this->super_Delaunay).
                                                                   vertex_stride_),0)]);
    }
    else {
      SVar9 = PCK::in_circle_2d_SOS((double *)local_48,local_40[0],local_40[1],p);
    }
    bVar8 = ZERO < SVar9;
  }
  return bVar8;
}

Assistant:

bool triangle_is_conflict(index_t t, const double* p) const {

            // Lookup triangle vertices
            const double* pv[3];
            for(index_t i=0; i<3; ++i) {
                signed_index_t v = triangle_vertex(t,i);
                pv[i] = (v == -1) ? nullptr : vertex_ptr(index_t(v));
            }

            // Check for virtual triangles (then in_circle()
            // is replaced with orient2d())
            for(index_t le = 0; le < 3; ++le) {

                if(pv[le] == nullptr) {

                    // Facet of a virtual triangle opposite to
                    // infinite vertex corresponds to
                    // the triangle on the convex hull of the points.
                    // Orientation is obtained by replacing vertex lf
                    // with p.
                    pv[le] = p;
                    Sign sign = PCK::orient_2d(pv[0],pv[1],pv[2]);

                    if(sign > 0) {
                        return true;
                    }

                    if(sign < 0) {
                        return false;
                    }

                    // If sign is zero, we check the real triangle
                    // adjacent to the facet on the convex hull.
                    geo_debug_assert(triangle_adjacent(t, le) >= 0);
                    index_t t2 = index_t(triangle_adjacent(t, le));
                    geo_debug_assert(!triangle_is_virtual(t2));

                    //  If t2 is already chained in the conflict list,
                    // then it is conflict
                    if(triangle_is_in_list(t2)) {
                        return true;
                    }

                    //  If t2 is marked, then it is not in conflict.
                    if(triangle_is_marked(t2)) {
                        return false;
                    }

                    return triangle_is_conflict(t2, p);
                }
            }

            //   If the triangle is a finite one, it is in conflict
            // if its circumscribed sphere contains the point (this is
            // the standard case).

            if(weighted_) {
                double h0 = heights_[finite_triangle_vertex(t, 0)];
                double h1 = heights_[finite_triangle_vertex(t, 1)];
                double h2 = heights_[finite_triangle_vertex(t, 2)];
                index_t pindex = index_t(
                    (p - vertex_ptr(0)) / int(vertex_stride_)
                );
                double h = heights_[pindex];
                return (PCK::orient_2dlifted_SOS(
                            pv[0],pv[1],pv[2],p,h0,h1,h2,h
                       ) > 0) ;
            }

            return (PCK::in_circle_2d_SOS(pv[0], pv[1], pv[2], p) > 0);
        }